

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int ifOutputVectorsAreConsistent(saucy *s,int *leftVec,int *rightVec)

{
  int iVar1;
  int local_38;
  int local_34;
  int count2;
  int count1;
  int j;
  int i;
  int *rightVec_local;
  int *leftVec_local;
  saucy *s_local;
  
  count1 = 0;
  while( true ) {
    iVar1 = Abc_NtkPoNum(s->pNtk);
    if (iVar1 <= count1) {
      return 1;
    }
    local_38 = 0;
    local_34 = 0;
    for (count2 = count1; count2 <= count1 + (s->right).clen[count1]; count2 = count2 + 1) {
      if (leftVec[(s->left).lab[count2]] != 0) {
        local_34 = local_34 + 1;
      }
      if (rightVec[(s->right).lab[count2]] != 0) {
        local_38 = local_38 + 1;
      }
    }
    if (local_34 != local_38) break;
    count1 = (s->right).clen[count1] + 1 + count1;
  }
  return 0;
}

Assistant:

static int
ifOutputVectorsAreConsistent( struct saucy * s, int * leftVec, int * rightVec )
{
    /* This function assumes that left and right partitions are isomorphic */
    int i, j;
    int count1, count2;

    for (i = 0; i < Abc_NtkPoNum(s->pNtk); i += (s->right.clen[i]+1)) {     
        count1 = count2 = 0;
        for (j = i; j <= (i + s->right.clen[i]); j++) {         
            if (leftVec[s->left.lab[j]]) count1++;
            if (rightVec[s->right.lab[j]]) count2++;
        }

        if (count1 != count2) return 0;
    }

    return 1;
}